

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O3

ssize_t __thiscall MeshLib::Solid::write(Solid *this,int __fd,void *__buf,size_t __n)

{
  Vertex *pVVar1;
  Edge *pEVar2;
  tEdge e;
  char cVar3;
  ssize_t sVar4;
  double *pdVar5;
  ostream *poVar6;
  tVertex pVVar7;
  Solid *this_00;
  ssize_t extraout_RAX;
  HalfEdge *pHVar8;
  ssize_t extraout_RAX_00;
  int i;
  int i_00;
  undefined4 in_register_00000034;
  Solid *this_01;
  Solid *pSVar9;
  HalfEdge *pHVar10;
  TreeIterator<MeshLib::Face> fiter;
  TreeIterator<MeshLib::Vertex> viter;
  TreeIterator<MeshLib::Edge> local_260;
  TreeIterator<MeshLib::Vertex> local_148;
  
  this_01 = (Solid *)CONCAT44(in_register_00000034,__fd);
  AVL::TreeIterator<MeshLib::Vertex>::TreeIterator(&local_148,&this->m_verts);
  cVar3 = (char)__fd;
  if (local_148.m_finished == false) {
    do {
      pVVar1 = (local_148.m_pointer)->data;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"Vertex ",7);
      std::ostream::operator<<((ostream *)this_01,pVVar1->m_id);
      i_00 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," ",1);
        pdVar5 = Point::operator[](&pVVar1->m_point,i_00);
        std::ostream::_M_insert<double>(*pdVar5);
        i_00 = i_00 + 1;
      } while (i_00 != 3);
      if ((pVVar1->m_string)._M_string_length != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," {",2);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)this_01,(pVVar1->m_string)._M_dataplus._M_p,
                            (pVVar1->m_string)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
      }
      std::ios::widen((char)this_01->_vptr_Solid[-3] + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      AVL::TreeIterator<MeshLib::Vertex>::operator++(&local_148);
    } while (local_148.m_finished != true);
  }
  AVL::TreeIterator<MeshLib::Face>::TreeIterator
            ((TreeIterator<MeshLib::Face> *)&local_260,&this->m_faces);
  if (local_260.m_finished == false) {
    do {
      pEVar2 = (local_260.m_pointer)->data;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"Face ",5);
      std::ostream::operator<<((ostream *)this_01,*(int *)pEVar2->m_halfedge);
      pHVar8 = pEVar2->m_halfedge[1];
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," ",1);
        std::ostream::operator<<((ostream *)this_01,pHVar8->m_vertex->m_id);
        pHVar8 = pHVar8->m_next;
      } while (pHVar8 != pEVar2->m_halfedge[1]);
      if ((pEVar2->m_string)._M_dataplus._M_p != (pointer)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," {",2);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)this_01,(char *)pEVar2->key,
                            (long)(pEVar2->m_string)._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
      }
      std::ios::widen((char)this_01->_vptr_Solid[-3] + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      AVL::TreeIterator<MeshLib::Face>::operator++((TreeIterator<MeshLib::Face> *)&local_260);
    } while (local_260.m_finished == false);
  }
  AVL::TreeIterator<MeshLib::Edge>::TreeIterator(&local_260,&this->m_edges);
  if (local_260.m_finished == false) {
    do {
      e = (local_260.m_pointer)->data;
      if ((e->m_string)._M_string_length != 0) {
        pSVar9 = this_01;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"Edge ",5);
        pVVar7 = edgeVertex1(pSVar9,e);
        this_00 = (Solid *)std::ostream::operator<<((ostream *)this_01,pVVar7->m_id);
        pSVar9 = this_00;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
        pVVar7 = edgeVertex2(pSVar9,e);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)this_00,pVVar7->m_id);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"{",1);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)this_01,(e->m_string)._M_dataplus._M_p,
                            (e->m_string)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
      }
      AVL::TreeIterator<MeshLib::Edge>::operator++(&local_260);
    } while (local_260.m_finished == false);
  }
  AVL::TreeIterator<MeshLib::Face>::TreeIterator
            ((TreeIterator<MeshLib::Face> *)&local_260,&this->m_faces);
  sVar4 = extraout_RAX;
  while (local_260.m_finished == false) {
    pEVar2 = (local_260.m_pointer)->data;
    pHVar8 = pEVar2->m_halfedge[1];
    pHVar10 = pHVar8;
    do {
      if ((pHVar10->m_string)._M_string_length != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"Corner ",7);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)this_01,pHVar10->m_vertex->m_id);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,pHVar10->m_face->m_id);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"{",1);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)this_01,(pHVar10->m_string)._M_dataplus._M_p,
                            (pHVar10->m_string)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        pHVar8 = pEVar2->m_halfedge[1];
      }
      pHVar10 = pHVar10->m_next;
    } while (pHVar10 != pHVar8);
    AVL::TreeIterator<MeshLib::Face>::operator++((TreeIterator<MeshLib::Face> *)&local_260);
    sVar4 = extraout_RAX_00;
  }
  return sVar4;
}

Assistant:

void Solid::write( std::ostream & os ) {
	//remove vertices
	AVL::TreeIterator<Vertex> viter( m_verts );
	for( ; !viter.end() ; ++ viter ) {
		tVertex v = *viter;

		os << "Vertex " << v->id();
		
		for( int i = 0; i < 3; i ++ ) {
			os << " " << v->point()[i];  
		}

		if( v->string().size() > 0 ) {
			os << " {" << v->string() << "}";
		}

		os << std::endl;
	}

	for( AVL::TreeIterator<Face> fiter(m_faces); !fiter.end(); ++ fiter ) {
		tFace f = *fiter;
		os << "Face " << f->id();
		tHalfEdge he = f->halfedge();
		do {
			os << " " << he->target()->id();
			he = he->he_next();
		} while( he != f->halfedge() );

		if( f->string().size() > 0 ) {
			os << " {" << f->string() << "}";
		}

		os << std::endl;
	}


	for( AVL::TreeIterator<Edge> eiter(m_edges); !eiter.end(); ++ eiter ) {
		tEdge e = *eiter;
		if( e->string().size() > 0 ) {
			os << "Edge " << edgeVertex1(e)->id()<< " " << edgeVertex2(e)->id() << " ";
			os << "{" << e->string() << "}" << std::endl;
		}
	}

	for( AVL::TreeIterator<Face> pfiter(m_faces); !pfiter.end(); ++ pfiter ) {
		tFace f = *pfiter;
		tHalfEdge he = f->halfedge();
		do{
			if( he->string().size() > 0 )
			{
				os << "Corner " << he->vertex()->id() << " " << he->face()->id() << " ";
				os <<"{" << he->string() << "}" << std::endl;
			}
			he = he->he_next();
		}while( he != f->halfedge() );
	}


}